

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

wchar_t el_wparse(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t wVar1;
  int iVar2;
  size_t __n;
  wchar_t *__dest;
  size_t l;
  wchar_t *tprog;
  wchar_t *pwStack_30;
  wchar_t i;
  wchar_t *ptr;
  wchar_t **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  if (argc < L'\x01') {
    return L'\xffffffff';
  }
  pwStack_30 = wcschr(*argv,L':');
  if (pwStack_30 == (wchar_t *)0x0) {
    pwStack_30 = *argv;
  }
  else {
    if (pwStack_30 == *argv) {
      return L'\0';
    }
    __n = (long)pwStack_30 - (long)*argv >> 2;
    __dest = (wchar_t *)calloc(__n + 1,4);
    if (__dest == (wchar_t *)0x0) {
      return L'\0';
    }
    wcsncpy(__dest,*argv,__n);
    __dest[__n] = L'\0';
    pwStack_30 = pwStack_30 + 1;
    wVar1 = el_match(el->el_prog,__dest);
    free(__dest);
    if (wVar1 == L'\0') {
      return L'\0';
    }
  }
  tprog._4_4_ = 0;
  while( true ) {
    if (cmds[tprog._4_4_].name == (wchar_t *)0x0) {
      return L'\xffffffff';
    }
    iVar2 = wcscmp(cmds[tprog._4_4_].name,pwStack_30);
    if (iVar2 == 0) break;
    tprog._4_4_ = tprog._4_4_ + 1;
  }
  wVar1 = (*cmds[tprog._4_4_].func)(el,argc,argv);
  return -wVar1;
}

Assistant:

int
el_wparse(EditLine *el, int argc, const wchar_t *argv[])
{
	const wchar_t *ptr;
	int i;

	if (argc < 1)
		return -1;
	ptr = wcschr(argv[0], L':');
	if (ptr != NULL) {
		wchar_t *tprog;
		size_t l;

		if (ptr == argv[0])
			return 0;
		l = (size_t)(ptr - argv[0]);
		tprog = el_calloc(l + 1, sizeof(*tprog));
		if (tprog == NULL)
			return 0;
		(void) wcsncpy(tprog, argv[0], l);
		tprog[l] = '\0';
		ptr++;
		l = (size_t)el_match(el->el_prog, tprog);
		el_free(tprog);
		if (!l)
			return 0;
	} else
		ptr = argv[0];

	for (i = 0; cmds[i].name != NULL; i++)
		if (wcscmp(cmds[i].name, ptr) == 0) {
			i = (*cmds[i].func) (el, argc, argv);
			return -i;
		}
	return -1;
}